

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O1

void __thiscall
cmOutputRequiredFilesCommand::ListDependencies
          (cmOutputRequiredFilesCommand *this,cmDependInformation *info,FILE *fout,
          set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
          *visited)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  long lVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  string tmp;
  long *local_a0 [2];
  long local_90 [2];
  cmOutputRequiredFilesCommand *local_80;
  cmDependInformation *local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_80 = this;
  local_78 = info;
  std::
  _Rb_tree<cmDependInformation_const*,cmDependInformation_const*,std::_Identity<cmDependInformation_const*>,std::less<cmDependInformation_const*>,std::allocator<cmDependInformation_const*>>
  ::_M_insert_unique<cmDependInformation_const*const&>
            ((_Rb_tree<cmDependInformation_const*,cmDependInformation_const*,std::_Identity<cmDependInformation_const*>,std::less<cmDependInformation_const*>,std::allocator<cmDependInformation_const*>>
              *)visited,&local_78);
  p_Var5 = (local_78->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var5 != &(local_78->DependencySet)._M_t._M_impl.super__Rb_tree_header) {
    p_Var1 = &(visited->_M_t)._M_impl.super__Rb_tree_header;
    do {
      p_Var6 = (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = &p_Var1->_M_header;
      if (p_Var6 != (_Base_ptr)0x0) {
        do {
          if (*(ulong *)(p_Var6 + 1) >= *(ulong *)(p_Var5 + 1)) {
            p_Var3 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < *(ulong *)(p_Var5 + 1)];
        } while (p_Var6 != (_Base_ptr)0x0);
      }
      p_Var6 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
         (p_Var6 = p_Var3, *(ulong *)(p_Var5 + 1) < *(ulong *)(p_Var3 + 1))) {
        p_Var6 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var6 == p_Var1) {
        iVar2 = std::__cxx11::string::compare((char *)&local_78->FullPath);
        if (iVar2 != 0) {
          lVar4 = *(long *)(*(long *)(p_Var5 + 1) + 0x40);
          local_a0[0] = local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,lVar4,*(long *)(*(long *)(p_Var5 + 1) + 0x48) + lVar4);
          lVar4 = std::__cxx11::string::rfind((char)(string *)local_a0,0x2e);
          if (lVar4 == -1) {
            bVar7 = false;
          }
          else {
            std::__cxx11::string::substr((ulong)local_50,(ulong)local_a0);
            iVar2 = std::__cxx11::string::compare((char *)local_50);
            bVar7 = iVar2 != 0;
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
          }
          if (bVar7) {
            std::__cxx11::string::substr((ulong)local_70,(ulong)local_a0);
            std::__cxx11::string::operator=((string *)local_a0,(string *)local_70);
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            fprintf((FILE *)fout,"%s\n",*(undefined8 *)(*(long *)(p_Var5 + 1) + 0x40));
          }
          if (local_a0[0] != local_90) {
            operator_delete(local_a0[0],local_90[0] + 1);
          }
        }
        ListDependencies(local_80,*(cmDependInformation **)(p_Var5 + 1),fout,visited);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 !=
             &(local_78->DependencySet)._M_t._M_impl.super__Rb_tree_header);
  }
  return;
}

Assistant:

void cmOutputRequiredFilesCommand::ListDependencies(
  cmDependInformation const* info, FILE* fout,
  std::set<cmDependInformation const*>* visited)
{
  // add info to the visited set
  visited->insert(info);
  // now recurse with info's dependencies
  for (cmDependInformation::DependencySetType::const_iterator d =
         info->DependencySet.begin();
       d != info->DependencySet.end(); ++d) {
    if (visited->find(*d) == visited->end()) {
      if (info->FullPath != "") {
        std::string tmp = (*d)->FullPath;
        std::string::size_type pos = tmp.rfind('.');
        if (pos != std::string::npos && (tmp.substr(pos) != ".h")) {
          tmp = tmp.substr(0, pos);
          fprintf(fout, "%s\n", (*d)->FullPath.c_str());
        }
      }
      this->ListDependencies(*d, fout, visited);
    }
  }
}